

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRGBA.cpp
# Opt level: O0

IVec4 __thiscall tcu::RGBA::toIVec(RGBA *this)

{
  int x_;
  int y_;
  int z_;
  int w_;
  undefined8 extraout_RDX;
  RGBA *in_RSI;
  IVec4 IVar1;
  RGBA *this_local;
  
  x_ = getRed(in_RSI);
  y_ = getGreen(in_RSI);
  z_ = getBlue(in_RSI);
  w_ = getAlpha(in_RSI);
  Vector<int,_4>::Vector((Vector<int,_4> *)this,x_,y_,z_,w_);
  IVar1.m_data[2] = (int)extraout_RDX;
  IVar1.m_data[3] = (int)((ulong)extraout_RDX >> 0x20);
  IVar1.m_data._0_8_ = this;
  return (IVec4)IVar1.m_data;
}

Assistant:

IVec4 RGBA::toIVec (void) const
{
	return IVec4(getRed(), getGreen(), getBlue(), getAlpha());
}